

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O0

unsigned_long_long __thiscall
KarpRabinHash<unsigned_long_long,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (KarpRabinHash<unsigned_long_long,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  size_type sVar1;
  byte *pbVar2;
  uint local_34;
  ulong uStack_30;
  uint j;
  unsigned_long_long x;
  ulong uStack_20;
  uint k;
  unsigned_long_long answer;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *c_local;
  KarpRabinHash<unsigned_long_long,_unsigned_char> *this_local;
  
  uStack_20 = 0;
  x._4_4_ = 0;
  while( true ) {
    sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
    if (sVar1 <= x._4_4_) break;
    uStack_30 = 1;
    local_34 = 0;
    while( true ) {
      sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
      if ((sVar1 - 1) - (ulong)x._4_4_ <= (ulong)local_34) break;
      uStack_30 = uStack_30 * 0x25 & *(ulong *)(this + 0x810);
      local_34 = local_34 + 1;
    }
    pbVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[](c,(ulong)x._4_4_)
    ;
    uStack_20 = uStack_20 +
                (uStack_30 * *(long *)(this + (ulong)*pbVar2 * 8 + 0x10) & *(ulong *)(this + 0x810))
                & *(ulong *)(this + 0x810);
    x._4_4_ = x._4_4_ + 1;
  }
  return uStack_20;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      hashvaluetype x(1);
      for (uint j = 0; j < c.size() - 1 - k; ++j) {
        x = (x * B) & HASHMASK;
      }
      x = (x * hasher.hashvalues[c[k]]) & HASHMASK;
      answer = (answer + x) & HASHMASK;
    }
    return answer;
  }